

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O0

ResourceReference *
dxil_spv::get_resource_reference
          (Impl *impl,ResourceType resource_type,CallInst *instruction,uint resource_range)

{
  mapped_type *pmVar1;
  CallInst *local_38;
  uint local_2c;
  CallInst *pCStack_28;
  uint resource_range_local;
  CallInst *instruction_local;
  Impl *pIStack_18;
  ResourceType resource_type_local;
  Impl *impl_local;
  
  local_2c = resource_range;
  pCStack_28 = instruction;
  instruction_local._7_1_ = resource_type;
  pIStack_18 = impl;
  if (resource_range == 0xffffffff) {
    local_38 = instruction;
    pmVar1 = std::
             unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AnnotateHandleReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>_>
             ::operator[](&impl->llvm_annotate_handle_uses,(key_type *)&local_38);
    impl_local = (Impl *)&pmVar1->reference;
  }
  else {
    switch(resource_type) {
    default:
      impl_local = (Impl *)std::
                           vector<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                           ::operator[](&impl->srv_index_to_reference,(ulong)resource_range);
      break;
    case UAV:
      impl_local = (Impl *)std::
                           vector<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                           ::operator[](&impl->uav_index_to_reference,(ulong)resource_range);
      break;
    case CBV:
      impl_local = (Impl *)std::
                           vector<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                           ::operator[](&impl->cbv_index_to_reference,(ulong)resource_range);
      break;
    case Sampler:
      impl_local = (Impl *)std::
                           vector<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                           ::operator[](&impl->sampler_index_to_reference,(ulong)resource_range);
    }
  }
  return (ResourceReference *)impl_local;
}

Assistant:

static Converter::Impl::ResourceReference &get_resource_reference(
		Converter::Impl &impl, DXIL::ResourceType resource_type,
		const llvm::CallInst *instruction, unsigned resource_range)
{
	if (resource_range == UINT32_MAX)
	{
		return impl.llvm_annotate_handle_uses[instruction].reference;
	}
	else
	{
		switch (resource_type)
		{
		default:
		case DXIL::ResourceType::SRV:
			return impl.srv_index_to_reference[resource_range];
		case DXIL::ResourceType::UAV:
			return impl.uav_index_to_reference[resource_range];
		case DXIL::ResourceType::CBV:
			return impl.cbv_index_to_reference[resource_range];
		case DXIL::ResourceType::Sampler:
			return impl.sampler_index_to_reference[resource_range];
		}
	}
}